

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_error.c
# Opt level: O0

void l2_internal_error(l2_internal_error_type error_type,...)

{
  undefined8 uVar1;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  void *ptr;
  char *msg;
  va_list va;
  l2_internal_error_type error_type_local;
  
  uVar1 = local_e0;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  va[0].overflow_arg_area = local_e8;
  va[0]._0_8_ = &stack0x00000008;
  local_e0 = in_RSI;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  va[0].reg_save_area._4_4_ = error_type;
  switch(error_type) {
  case L2_INTERNAL_ERROR_OUT_OF_RANGE:
    msg._4_4_ = 0x30;
    msg._0_4_ = 0x10;
    fprintf(_stderr,anon_var_dwarf_1925,uVar1);
    break;
  case L2_INTERNAL_ERROR_NULL_POINTER:
    msg._4_4_ = 0x30;
    msg._0_4_ = 0x10;
    fprintf(_stderr,anon_var_dwarf_1907,uVar1);
    break;
  case L2_INTERNAL_ERROR_ILLEGAL_OPERATION:
    msg._4_4_ = 0x30;
    msg._0_4_ = 0x10;
    fprintf(_stderr,anon_var_dwarf_193b,uVar1);
    break;
  case L2_INTERNAL_ERROR_UNREACHABLE_CODE:
    msg._4_4_ = 0x30;
    msg._0_4_ = 0x10;
    fprintf(_stderr,anon_var_dwarf_1951,uVar1);
    break;
  case L2_INTERNAL_ERROR_MEM_BLOCK_NOT_MANAGED:
    msg._4_4_ = 0x30;
    msg._0_4_ = 0x10;
    fprintf(_stderr,anon_var_dwarf_1967,uVar1);
    break;
  case L2_INTERNAL_ERROR_MEM_BLOCK_NOT_IN_GC:
    msg._4_4_ = 0x30;
    msg._0_4_ = 0x10;
    fprintf(_stderr,anon_var_dwarf_197d,uVar1);
    break;
  default:
    msg._4_4_ = 0x30;
    msg._0_4_ = 0x10;
    fprintf(_stderr,anon_var_dwarf_1993,uVar1);
  }
  fprintf(_stderr,anon_var_dwarf_199d);
  l2_clean_before_abort();
  exit(va[0].reg_save_area._4_4_);
}

Assistant:

void _Noreturn l2_internal_error(const l2_internal_error_type error_type, ...) {
    va_list va;
    va_start(va, error_type);
    char *msg;
    void *ptr;

    switch (error_type) {
        case L2_INTERNAL_ERROR_NULL_POINTER:
            msg = va_arg(va, char *);
            fprintf(stderr, "L2 解释器内部错误: \n\t使用空指针进行操作: %s\n", msg);
            break;

        case L2_INTERNAL_ERROR_OUT_OF_RANGE:
            msg = va_arg(va, char *);
            fprintf(stderr, "L2 解释器内部错误: \n\t超出数据范围: %s\n", msg);
            break;

        case L2_INTERNAL_ERROR_ILLEGAL_OPERATION:
            msg = va_arg(va, char *);
            fprintf(stderr, "L2 解释器内部错误: \n\t检测到非法操作: %s\n", msg);
            break;

        case L2_INTERNAL_ERROR_UNREACHABLE_CODE:
            msg = va_arg(va, char *);
            fprintf(stderr, "L2 解释器内部错误: \n\t运行至无法到达的代码段: %s\n", msg);
            break;

        case L2_INTERNAL_ERROR_MEM_BLOCK_NOT_MANAGED:
            ptr = va_arg(va, void *);
            fprintf(stderr, "L2 解释器内部错误: \n\t内存区块未托管: 指针 - %p\n", ptr);
            break;

        case L2_INTERNAL_ERROR_MEM_BLOCK_NOT_IN_GC:
            ptr = va_arg(va, void *);
            fprintf(stderr, "L2 解释器内部错误: \n\t内存区块未在 GC(垃圾回收) 链中: 指针 - %p\n", ptr);
            break;

        default:
            msg = va_arg(va, char *);
            fprintf(stderr, "L2 解释器内部错误: \n\t发生未知错误: %s\n", msg);
    }

    fprintf(stderr, "L2 解释器已异常终止\n");

    va_end(va);
    l2_clean_before_abort();
    exit(error_type);
}